

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QDockAreaLayoutItem *item)

{
  QDebug *o;
  long in_RDX;
  QDockAreaLayoutItem *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  uint7 in_stack_ffffffffffffffc8;
  byte bVar1;
  QDockAreaLayoutItem *item_00;
  Stream *dbg_00;
  QDebug local_18;
  undefined1 *local_10;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  item_00 = in_RSI;
  dbg_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  bVar1 = 0;
  if (in_RDX == 0) {
    o = QDebug::operator<<((QDebug *)(ulong)in_stack_ffffffffffffffc8,t);
    QDebug::QDebug((QDebug *)in_RDI,o);
  }
  else {
    QDebug::QDebug(&local_18,(QDebug *)in_RSI);
    bVar1 = 1;
    operator<<((QDebug *)dbg_00,item_00);
  }
  if ((bVar1 & 1) != 0) {
    QDebug::~QDebug(&local_18);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(char **)(in_FS_OFFSET + 0x28) != t) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem *item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    return item ? dbg << *item : dbg << "QDockAreaLayoutItem(0x0)";
}